

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcap.c
# Opt level: O0

int runtimecap(CapState *cs,Capture *close,char *s,int *rem)

{
  lua_State *L_00;
  int iVar1;
  int idx;
  int iVar2;
  Capture *cap;
  int local_4c;
  int i;
  Capture *open;
  int otop;
  lua_State *L;
  int id;
  int n;
  int *rem_local;
  char *s_local;
  Capture *close_local;
  CapState *cs_local;
  
  L_00 = cs->L;
  iVar1 = lua_gettop(L_00);
  cap = findopen(close);
  idx = finddyncap(cap,close);
  close->kind = '\0';
  close->s = s;
  cs->cap = cap;
  cs->valuecached = 0;
  luaL_checkstack(L_00,4,"too many runtime captures");
  lua_rawgeti(cs->L,cs->ptop + 3,(ulong)cs->cap->idx);
  lua_pushvalue(L_00,2);
  lua_pushinteger(L_00,(lua_Integer)(s + (1 - (long)cs->s)));
  iVar2 = pushnestedvalues(cs,0);
  lua_callk(L_00,iVar2 + 2,-1,0,(lua_KFunction)0x0);
  local_4c = idx;
  if (idx < 1) {
    *rem = 0;
  }
  else {
    for (; local_4c <= iVar1; local_4c = local_4c + 1) {
      lua_rotate(L_00,idx,-1);
      lua_settop(L_00,-2);
    }
    *rem = (iVar1 - idx) + 1;
  }
  return (int)((long)close - (long)cap >> 4);
}

Assistant:

int runtimecap (CapState *cs, Capture *close, const char *s, int *rem) {
  int n, id;
  lua_State *L = cs->L;
  int otop = lua_gettop(L);
  Capture *open = findopen(close);
  assert(captype(open) == Cgroup);
  id = finddyncap(open, close);  /* get first dynamic capture argument */
  close->kind = Cclose;  /* closes the group */
  close->s = s;
  cs->cap = open; cs->valuecached = 0;  /* prepare capture state */
  luaL_checkstack(L, 4, "too many runtime captures");
  pushluaval(cs);  /* push function to be called */
  lua_pushvalue(L, SUBJIDX);  /* push original subject */
  lua_pushinteger(L, s - cs->s + 1);  /* push current position */
  n = pushnestedvalues(cs, 0);  /* push nested captures */
  lua_call(L, n + 2, LUA_MULTRET);  /* call dynamic function */
  if (id > 0) {  /* are there old dynamic captures to be removed? */
    int i;
    for (i = id; i <= otop; i++)
      lua_remove(L, id);  /* remove old dynamic captures */
    *rem = otop - id + 1;  /* total number of dynamic captures removed */
  }
  else
    *rem = 0;  /* no dynamic captures removed */
  return close - open;  /* number of captures of all kinds removed */
}